

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V2_TextObject::Write(ON_OBSOLETE_V2_TextObject *this,ON_BinaryArchive *file)

{
  bool bVar1;
  
  bVar1 = ON_OBSOLETE_V2_Annotation::Write(&this->super_ON_OBSOLETE_V2_Annotation,file);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteString(file,&this->m_facename);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_fontweight);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_height);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool ON_OBSOLETE_V2_TextObject::Write( ON_BinaryArchive& file ) const
{
  bool rc = ON_OBSOLETE_V2_Annotation::Write( file );
  if( rc )
    rc = file.WriteString( m_facename );
  if( rc )
    rc = file.WriteInt( m_fontweight );
  if( rc )
    rc = file.WriteDouble( m_height );
  return rc;
}